

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O2

ssize_t __thiscall DomUI::write(DomUI *this,int __fd,void *__buf,size_t __n)

{
  long lVar1;
  DomWidget *this_00;
  DomLayoutDefault *this_01;
  DomLayoutFunction *this_02;
  DomCustomWidgets *this_03;
  DomTabStops *this_04;
  DomIncludes *this_05;
  DomResources *this_06;
  DomConnections *this_07;
  DomDesignerData *this_08;
  DomSlots *this_09;
  DomButtonGroups *this_10;
  char16_t *pcVar2;
  short sVar3;
  uint uVar4;
  undefined4 in_register_00000034;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar5;
  char16_t *pcVar6;
  anon_union_8_3_8ad491a7_for_QAnyStringView_6 aVar7;
  long in_FS_OFFSET;
  QAnyStringView QVar8;
  QAnyStringView QVar9;
  QAnyStringView QVar10;
  QAnyStringView QVar11;
  QAnyStringView QVar12;
  QAnyStringView QVar13;
  QAnyStringView QVar14;
  QAnyStringView QVar15;
  QAnyStringView QVar16;
  QAnyStringView QVar17;
  QAnyStringView QVar18;
  QAnyStringView QVar19;
  QAnyStringView QVar20;
  QAnyStringView QVar21;
  QAnyStringView QVar22;
  QAnyStringView QVar23;
  QAnyStringView QVar24;
  QAnyStringView QVar25;
  QAnyStringView QVar26;
  QAnyStringView QVar27;
  QAnyStringView QVar28;
  QAnyStringView QVar29;
  QAnyStringView QVar30;
  QAnyStringView QVar31;
  QAnyStringView QVar32;
  size_t sStack_90;
  QArrayDataPointer<char16_t> local_80;
  QArrayDataPointer<char16_t> local_68;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  aVar5._4_4_ = in_register_00000034;
  aVar5._0_4_ = __fd;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)((long)__buf + 0x10);
  if (lVar1 == 0) {
    local_50.d = (Data *)0x0;
    local_68.d = (Data *)0x0;
    local_68.ptr = (char16_t *)0x0;
    local_68.size = 0;
    local_50.ptr = L"ui";
    local_50.size = 2;
  }
  else {
    QString::toLower_helper((QString *)&local_50);
  }
  QVar8.m_size = (size_t)local_50.ptr;
  QVar8.field_0.m_data = aVar5.m_data;
  QXmlStreamWriter::writeStartElement(QVar8);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  if (lVar1 == 0) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_68);
  }
  if (this->m_has_attr_version == true) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"version",7);
    QVar21.field_0.m_data = (void *)(local_50.size | 0x8000000000000000);
    local_80.d = (this->m_attr_version).d.d;
    __n = (size_t)(this->m_attr_version).d.ptr;
    local_80.size = (this->m_attr_version).d.size;
    if (local_80.d != (Data *)0x0) {
      LOCK();
      ((local_80.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_80.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QVar9.m_size = (size_t)local_50.ptr;
    QVar9.field_0.m_data = aVar5.m_data;
    QVar21.m_size = __n;
    local_80.ptr = (char16_t *)__n;
    QXmlStreamWriter::writeAttribute(QVar9,QVar21);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  if (this->m_has_attr_language == true) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"language",8);
    QVar22.field_0.m_data = (void *)(local_50.size | 0x8000000000000000);
    local_80.d = (this->m_attr_language).d.d;
    __n = (size_t)(this->m_attr_language).d.ptr;
    local_80.size = (this->m_attr_language).d.size;
    if (local_80.d != (Data *)0x0) {
      LOCK();
      ((local_80.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_80.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QVar10.m_size = (size_t)local_50.ptr;
    QVar10.field_0.m_data = aVar5.m_data;
    QVar22.m_size = __n;
    local_80.ptr = (char16_t *)__n;
    QXmlStreamWriter::writeAttribute(QVar10,QVar22);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  if (this->m_has_attr_displayname == true) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"displayname",0xb);
    QVar23.field_0.m_data = (void *)(local_50.size | 0x8000000000000000);
    local_80.d = (this->m_attr_displayname).d.d;
    __n = (size_t)(this->m_attr_displayname).d.ptr;
    local_80.size = (this->m_attr_displayname).d.size;
    if (local_80.d != (Data *)0x0) {
      LOCK();
      ((local_80.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_80.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    QVar11.m_size = (size_t)local_50.ptr;
    QVar11.field_0.m_data = aVar5.m_data;
    QVar23.m_size = __n;
    local_80.ptr = (char16_t *)__n;
    QXmlStreamWriter::writeAttribute(QVar11,QVar23);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  if (this->m_has_attr_idbasedtr == true) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"idbasedtr",9);
    pcVar2 = local_50.ptr;
    aVar7.m_data = (void *)(local_50.size | 0x8000000000000000);
    if (this->m_attr_idbasedtr == true) {
      pcVar6 = L"true";
      sStack_90 = 4;
    }
    else {
      pcVar6 = L"false";
      sStack_90 = 5;
    }
    Qt::Literals::StringLiterals::operator____s((QString *)&local_80,pcVar6,sStack_90);
    QVar12.m_size = (size_t)pcVar2;
    QVar12.field_0.m_data = aVar5.m_data;
    QVar24.m_size = (size_t)local_80.ptr;
    QVar24.field_0.m_data = aVar7.m_data;
    __n = (size_t)local_80.ptr;
    QXmlStreamWriter::writeAttribute(QVar12,QVar24);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  if (this->m_has_attr_connectslotsbyname == true) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"connectslotsbyname",0x12);
    pcVar2 = local_50.ptr;
    aVar7.m_data = (void *)(local_50.size | 0x8000000000000000);
    if (this->m_attr_connectslotsbyname == true) {
      pcVar6 = L"true";
      sStack_90 = 4;
    }
    else {
      pcVar6 = L"false";
      sStack_90 = 5;
    }
    Qt::Literals::StringLiterals::operator____s((QString *)&local_80,pcVar6,sStack_90);
    QVar13.m_size = (size_t)pcVar2;
    QVar13.field_0.m_data = aVar5.m_data;
    QVar25.m_size = (size_t)local_80.ptr;
    QVar25.field_0.m_data = aVar7.m_data;
    __n = (size_t)local_80.ptr;
    QXmlStreamWriter::writeAttribute(QVar13,QVar25);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  if (this->m_has_attr_stdsetdef == true) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"stdsetdef",9);
    pcVar2 = local_50.ptr;
    aVar7.m_data = (void *)(local_50.size | 0x8000000000000000);
    QString::number((int)&local_80,this->m_attr_stdsetdef);
    QVar14.m_size = (size_t)pcVar2;
    QVar14.field_0.m_data = aVar5.m_data;
    QVar26.m_size = (size_t)local_80.ptr;
    QVar26.field_0.m_data = aVar7.m_data;
    __n = (size_t)local_80.ptr;
    QXmlStreamWriter::writeAttribute(QVar14,QVar26);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  if (this->m_has_attr_stdSetDef == true) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"stdsetdef",9);
    pcVar2 = local_50.ptr;
    aVar7.m_data = (void *)(local_50.size | 0x8000000000000000);
    QString::number((int)&local_80,this->m_attr_stdSetDef);
    QVar15.m_size = (size_t)pcVar2;
    QVar15.field_0.m_data = aVar5.m_data;
    QVar27.m_size = (size_t)local_80.ptr;
    QVar27.field_0.m_data = aVar7.m_data;
    __n = (size_t)local_80.ptr;
    QXmlStreamWriter::writeAttribute(QVar15,QVar27);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  uVar4 = this->m_children;
  if ((uVar4 & 1) != 0) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"author",6);
    QVar28.field_0.m_data = (void *)(local_50.size | 0x8000000000000000);
    __n = (size_t)(this->m_author).d.ptr;
    QVar16.m_size = (size_t)local_50.ptr;
    QVar16.field_0.m_data = aVar5.m_data;
    QVar28.m_size = __n;
    QXmlStreamWriter::writeTextElement(QVar16,QVar28);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    uVar4 = this->m_children;
  }
  if ((uVar4 & 2) != 0) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"comment",7);
    QVar29.field_0.m_data = (void *)(local_50.size | 0x8000000000000000);
    __n = (size_t)(this->m_comment).d.ptr;
    QVar17.m_size = (size_t)local_50.ptr;
    QVar17.field_0.m_data = aVar5.m_data;
    QVar29.m_size = __n;
    QXmlStreamWriter::writeTextElement(QVar17,QVar29);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    uVar4 = this->m_children;
  }
  if ((uVar4 & 4) != 0) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"exportmacro",0xb);
    QVar30.field_0.m_data = (void *)(local_50.size | 0x8000000000000000);
    __n = (size_t)(this->m_exportMacro).d.ptr;
    QVar18.m_size = (size_t)local_50.ptr;
    QVar18.field_0.m_data = aVar5.m_data;
    QVar30.m_size = __n;
    QXmlStreamWriter::writeTextElement(QVar18,QVar30);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    uVar4 = this->m_children;
  }
  if ((uVar4 & 8) != 0) {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"class",5);
    QVar31.field_0.m_data = (void *)(local_50.size | 0x8000000000000000);
    __n = (size_t)(this->m_class).d.ptr;
    QVar19.m_size = (size_t)local_50.ptr;
    QVar19.field_0.m_data = aVar5.m_data;
    QVar31.m_size = __n;
    QXmlStreamWriter::writeTextElement(QVar19,QVar31);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    uVar4 = this->m_children;
  }
  if ((uVar4 & 0x10) != 0) {
    this_00 = this->m_widget;
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"widget",6);
    DomWidget::write(this_00,__fd,&local_50,__n);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    uVar4 = this->m_children;
  }
  if ((uVar4 & 0x20) != 0) {
    this_01 = this->m_layoutDefault;
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"layoutdefault",0xd);
    DomLayoutDefault::write(this_01,__fd,&local_50,__n);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    uVar4 = this->m_children;
  }
  if ((uVar4 & 0x40) != 0) {
    this_02 = this->m_layoutFunction;
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"layoutfunction",0xe);
    DomLayoutFunction::write(this_02,__fd,&local_50,__n);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    uVar4 = this->m_children;
  }
  if ((char)uVar4 < '\0') {
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"pixmapfunction",0xe);
    QVar32.field_0.m_data = (void *)(local_50.size | 0x8000000000000000);
    __n = (size_t)(this->m_pixmapFunction).d.ptr;
    QVar20.m_size = (size_t)local_50.ptr;
    QVar20.field_0.m_data = aVar5.m_data;
    QVar32.m_size = __n;
    QXmlStreamWriter::writeTextElement(QVar20,QVar32);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    uVar4 = this->m_children;
  }
  if ((uVar4 >> 8 & 1) != 0) {
    this_03 = this->m_customWidgets;
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"customwidgets",0xd);
    DomCustomWidgets::write(this_03,__fd,&local_50,__n);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    uVar4 = this->m_children;
  }
  if ((uVar4 >> 9 & 1) != 0) {
    this_04 = this->m_tabStops;
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"tabstops",8);
    DomTabStops::write(this_04,__fd,&local_50,__n);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    uVar4 = this->m_children;
  }
  if ((uVar4 >> 10 & 1) != 0) {
    this_05 = this->m_includes;
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"includes",8);
    DomIncludes::write(this_05,__fd,&local_50,__n);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    uVar4 = this->m_children;
  }
  if ((uVar4 >> 0xb & 1) != 0) {
    this_06 = this->m_resources;
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"resources",9);
    DomResources::write(this_06,__fd,&local_50,__n);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    uVar4 = this->m_children;
  }
  if ((uVar4 >> 0xc & 1) != 0) {
    this_07 = this->m_connections;
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"connections",0xb);
    DomConnections::write(this_07,__fd,&local_50,__n);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    uVar4 = this->m_children;
  }
  if ((uVar4 >> 0xd & 1) != 0) {
    this_08 = this->m_designerdata;
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"designerdata",0xc);
    DomDesignerData::write(this_08,__fd,&local_50,__n);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    uVar4 = this->m_children;
  }
  sVar3 = (short)uVar4;
  if ((uVar4 >> 0xe & 1) != 0) {
    this_09 = this->m_slots;
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"slots",5);
    DomSlots::write(this_09,__fd,&local_50,__n);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
    sVar3 = (short)this->m_children;
  }
  if (sVar3 < 0) {
    this_10 = this->m_buttonGroups;
    Qt::Literals::StringLiterals::operator____s((QString *)&local_50,L"buttongroups",0xc);
    DomButtonGroups::write(this_10,__fd,&local_50,__n);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return *(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void DomUI::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("ui") : tagName.toLower());

    if (hasAttributeVersion())
        writer.writeAttribute(u"version"_s, attributeVersion());

    if (hasAttributeLanguage())
        writer.writeAttribute(u"language"_s, attributeLanguage());

    if (hasAttributeDisplayname())
        writer.writeAttribute(u"displayname"_s, attributeDisplayname());

    if (hasAttributeIdbasedtr())
        writer.writeAttribute(u"idbasedtr"_s, (attributeIdbasedtr() ? u"true"_s : u"false"_s));

    if (hasAttributeConnectslotsbyname())
        writer.writeAttribute(u"connectslotsbyname"_s, (attributeConnectslotsbyname() ? u"true"_s : u"false"_s));

    if (hasAttributeStdsetdef())
        writer.writeAttribute(u"stdsetdef"_s, QString::number(attributeStdsetdef()));

    if (hasAttributeStdSetDef())
        writer.writeAttribute(u"stdsetdef"_s, QString::number(attributeStdSetDef()));

    if (m_children & Author)
        writer.writeTextElement(u"author"_s, m_author);

    if (m_children & Comment)
        writer.writeTextElement(u"comment"_s, m_comment);

    if (m_children & ExportMacro)
        writer.writeTextElement(u"exportmacro"_s, m_exportMacro);

    if (m_children & Class)
        writer.writeTextElement(u"class"_s, m_class);

    if (m_children & Widget)
        m_widget->write(writer, u"widget"_s);

    if (m_children & LayoutDefault)
        m_layoutDefault->write(writer, u"layoutdefault"_s);

    if (m_children & LayoutFunction)
        m_layoutFunction->write(writer, u"layoutfunction"_s);

    if (m_children & PixmapFunction)
        writer.writeTextElement(u"pixmapfunction"_s, m_pixmapFunction);

    if (m_children & CustomWidgets)
        m_customWidgets->write(writer, u"customwidgets"_s);

    if (m_children & TabStops)
        m_tabStops->write(writer, u"tabstops"_s);

    if (m_children & Includes)
        m_includes->write(writer, u"includes"_s);

    if (m_children & Resources)
        m_resources->write(writer, u"resources"_s);

    if (m_children & Connections)
        m_connections->write(writer, u"connections"_s);

    if (m_children & Designerdata)
        m_designerdata->write(writer, u"designerdata"_s);

    if (m_children & Slots)
        m_slots->write(writer, u"slots"_s);

    if (m_children & ButtonGroups)
        m_buttonGroups->write(writer, u"buttongroups"_s);

    writer.writeEndElement();
}